

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

optional<std::pair<unsigned_int,_int>_>
miniscript::internal::ParseKeyEnd<unsigned_int,(anonymous_namespace)::KeyParser>
          (Span<const_char> in,KeyParser *ctx)

{
  long lVar1;
  undefined4 extraout_var;
  _Storage<std::pair<unsigned_int,_int>,_true> _Var2;
  undefined4 uVar3;
  char in_CL;
  undefined8 extraout_RDX;
  internal *this;
  ulong uVar4;
  long in_FS_OFFSET;
  Span<const_char> sp;
  optional<std::pair<unsigned_int,_int>_> oVar5;
  
  sp.m_data = (char *)in.m_size;
  this = (internal *)in.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sp.m_size = 0x29;
  _Var2._0_4_ = FindNextChar(this,sp,in_CL);
  _Var2._M_value.second = extraout_var;
  if (0 < (int)_Var2._0_4_) {
    uVar4 = (ulong)_Var2._0_4_;
    _Var2._M_value =
         (pair<unsigned_int,_int>)
         (anonymous_namespace)::KeyParser::FromString<char_const*>
                   ((KeyParser *)ctx,(char *)this,(char *)(this + uVar4));
    if (((ulong)_Var2 >> 0x20 & 1) != 0) {
      _Var2 = (_Storage<std::pair<unsigned_int,_int>,_true>)
              ((ulong)_Var2 & 0xffffffff | uVar4 << 0x20);
      uVar3 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      goto LAB_00acb672;
    }
  }
  uVar3 = 0;
LAB_00acb672:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar5.super__Optional_base<std::pair<unsigned_int,_int>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<unsigned_int,_int>_>._8_4_ = uVar3;
    oVar5.super__Optional_base<std::pair<unsigned_int,_int>,_true,_true>._M_payload.
    super__Optional_payload_base<std::pair<unsigned_int,_int>_>._M_payload = _Var2;
    return (optional<std::pair<unsigned_int,_int>_>)
           oVar5.super__Optional_base<std::pair<unsigned_int,_int>,_true,_true>._M_payload.
           super__Optional_payload_base<std::pair<unsigned_int,_int>_>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<Key, int>> ParseKeyEnd(Span<const char> in, const Ctx& ctx)
{
    int key_size = FindNextChar(in, ')');
    if (key_size < 1) return {};
    auto key = ctx.FromString(in.begin(), in.begin() + key_size);
    if (!key) return {};
    return {{std::move(*key), key_size}};
}